

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O2

int64_t npas4::GetRAMSystemTotal(void)

{
  sysinfo memInfo;
  sysinfo sStack_78;
  
  sysinfo(&sStack_78);
  return (ulong)sStack_78.mem_unit *
         (sStack_78.totalswap + sStack_78.totalram + sStack_78.totalhigh);
}

Assistant:

int64_t npas4::GetRAMSystemTotal()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullTotalPhys) + static_cast<int64_t>(memInfo.ullTotalVirtual);
#else
	// Prefer sysctl() over sysconf() except sysctl() HW_REALMEM and HW_PHYSMEM
	// return static_cast<int64_t>(sysconf(_SC_PHYS_PAGES)) * static_cast<int64_t>(sysconf(_SC_PAGE_SIZE));
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	int64_t total = memInfo.totalram;
	total += memInfo.totalswap;
	total += memInfo.totalhigh;
	return total * static_cast<int64_t>(memInfo.mem_unit);
#endif
}